

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O3

bool __thiscall
msgpack11::
Value<(msgpack11::MsgPack::Type)15,_std::map<msgpack11::MsgPack,_msgpack11::MsgPack,_std::less<msgpack11::MsgPack>,_std::allocator<std::pair<const_msgpack11::MsgPack,_msgpack11::MsgPack>_>_>_>
::less(Value<(msgpack11::MsgPack::Type)15,_std::map<msgpack11::MsgPack,_msgpack11::MsgPack,_std::less<msgpack11::MsgPack>,_std::allocator<std::pair<const_msgpack11::MsgPack,_msgpack11::MsgPack>_>_>_>
       *this,MsgPackValue *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = (*other->_vptr_MsgPackValue[3])(other);
  iVar3 = (*other->_vptr_MsgPackValue[3])(other);
  bVar1 = true;
  if (iVar3 < 0x10) {
    if (iVar2 == 0xf) {
      bVar1 = std::
              __lexicographical_compare_impl<std::_Rb_tree_const_iterator<std::pair<msgpack11::MsgPack_const,msgpack11::MsgPack>>,std::_Rb_tree_const_iterator<std::pair<msgpack11::MsgPack_const,msgpack11::MsgPack>>,__gnu_cxx::__ops::_Iter_less_iter>
                        ((this->m_value)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                         &(this->m_value)._M_t._M_impl.super__Rb_tree_header,
                         other[4]._vptr_MsgPackValue,other + 2);
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool less(const MsgPackValue * other) const override {
        bool const is_same_type = tag == other->type();
        bool const is_less_type = tag < other->type();
        return is_less_type || (is_same_type && (m_value < static_cast<const Value<tag, T> *>(other)->m_value));
    }